

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstructorCache.cpp
# Opt level: O0

void __thiscall
Js::ConstructorCache::ConstructorCache(ConstructorCache *this,ConstructorCache *other)

{
  code *pcVar1;
  bool bVar2;
  intptr_t value;
  undefined4 *puVar3;
  ConstructorCache *other_local;
  ConstructorCache *this_local;
  
  value = PropertyGuard::GetValue(&other->super_PropertyGuard);
  PropertyGuard::PropertyGuard(&this->super_PropertyGuard,value);
  ContentStruct::ContentStruct(&this->content);
  if (other == (ConstructorCache *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x21,"(other != nullptr)","other != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  Memory::WriteBarrierPtr<Js::ScriptContext>::operator=
            (&(this->content).scriptContext,&(other->content).scriptContext);
  (this->content).slotCount = (other->content).slotCount;
  (this->content).inlineSlotCount = (other->content).inlineSlotCount;
  (this->content).updateAfterCtor = (Type)((other->content).updateAfterCtor & 1);
  (this->content).field_0x14 = (this->content).field_0x14 & 0xf7 | (other->content).field_0x14 & 8;
  (this->content).field_0x14 =
       (this->content).field_0x14 & 0xef | (other->content).field_0x14 & 0x10;
  (this->content).field_0x14 = (this->content).field_0x14 & 0xfe | (other->content).field_0x14 & 1;
  (this->content).field_0x14 = (this->content).field_0x14 & 0xfd | (other->content).field_0x14 & 2;
  (this->content).field_0x14 = (this->content).field_0x14 & 0xfb | (other->content).field_0x14 & 4;
  (this->content).field_0x14 =
       (this->content).field_0x14 & 0xdf | (other->content).field_0x14 & 0x20;
  (this->content).field_0x14 =
       (this->content).field_0x14 & 0xbf | ((byte)(other->content).field_0x14 >> 6 & 1) << 6;
  (this->content).callCount = (other->content).callCount;
  bVar2 = IsConsistent(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x2e,"(IsConsistent())","IsConsistent()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

ConstructorCache::ConstructorCache(ConstructorCache const * other) : PropertyGuard(other->GetValue())
    {
        Assert(other != nullptr);
        this->content.scriptContext = other->content.scriptContext;
        this->content.slotCount = other->content.slotCount;
        this->content.inlineSlotCount = other->content.inlineSlotCount;
        this->content.updateAfterCtor = other->content.updateAfterCtor;
        this->content.ctorHasNoExplicitReturnValue = other->content.ctorHasNoExplicitReturnValue;
        this->content.skipDefaultNewObject = other->content.skipDefaultNewObject;
        this->content.isPopulated = other->content.isPopulated;
        this->content.isPolymorphic = other->content.isPolymorphic;
        this->content.typeUpdatePending = other->content.typeUpdatePending;
        this->content.typeIsFinal = other->content.typeIsFinal;
        this->content.hasPrototypeChanged = other->content.hasPrototypeChanged;
        this->content.callCount = other->content.callCount;
        Assert(IsConsistent());
    }